

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getenv.c
# Opt level: O1

char * getenv(char *__name)

{
  char *__s1;
  int iVar1;
  size_t __n;
  undefined8 *puVar2;
  
  __n = strlen(__name);
  __s1 = (char *)*_environ;
  puVar2 = _environ;
  while( true ) {
    if (__s1 == (char *)0x0) {
      return (char *)0x0;
    }
    puVar2 = puVar2 + 1;
    iVar1 = strncmp(__s1,__name,__n);
    if (iVar1 == 0) break;
    __s1 = (char *)*puVar2;
  }
  return __s1 + __n + 1;
}

Assistant:

char * getenv( const char * name )
{
    size_t len = strlen( name );
    size_t index = 0;

    while ( environ[ index ] != NULL )
    {
        if ( strncmp( environ[ index ], name, len ) == 0 )
        {
            return environ[ index ] + len + 1;
        }

        index++;
    }

    return NULL;
}